

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void hexdump(char *data,char *mask,size_t len)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  int loffset;
  int j;
  int i;
  int char_covered;
  int offset;
  char *reset;
  char *bold_gray;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  local_2c = 0;
  do {
    printf("#%07x: ",(ulong)local_2c);
    local_30 = 0;
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        iVar1 = local_2c + local_34 * 2 + local_38;
        if (in_EDX <= iVar1) goto LAB_00103fa7;
        if ((in_RSI != 0) && (*(char *)(in_RSI + iVar1) != '\0')) {
          printf("%s","\x1b[30;1m");
        }
        printf("%02x",(ulong)*(byte *)(in_RDI + iVar1));
        if ((in_RSI != 0) && (*(char *)(in_RSI + iVar1) != '\0')) {
          printf("%s","\x1b[0m");
        }
        local_30 = local_30 + 2;
      }
      printf(" ");
      local_30 = local_30 + 1;
    }
LAB_00103fa7:
    for (local_40 = local_30; local_40 < 0x29; local_40 = local_40 + 1) {
      printf(" ");
    }
    for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
      iVar1 = isprint((int)*(char *)(in_RDI + (int)(local_2c + local_44)));
      if (iVar1 == 0) {
        printf(".");
      }
      else {
        printf("%c",(ulong)(uint)(int)*(char *)(in_RDI + (int)(local_2c + local_44)));
      }
    }
    printf("\n");
    local_2c = local_2c + 0x10;
    if (in_EDX <= (int)local_2c) {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}